

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_privkey.cpp
# Opt level: O2

void __thiscall
Privkey_Privkey_ByteData_Error_Test::TestBody(Privkey_Privkey_ByteData_Error_Test *this)

{
  char *in_R9;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_58;
  AssertHelper local_50;
  Privkey privkey;
  ByteData bytedata;
  
  std::__cxx11::string::string
            ((string *)&privkey,"305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f2701"
             ,(allocator *)&sStack_58);
  cfd::core::ByteData::ByteData(&bytedata,(string *)&privkey);
  std::__cxx11::string::~string((string *)&privkey);
  cfd::core::Privkey::Privkey(&privkey,&bytedata,kMainnet,true);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&privkey);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&bytedata);
  bytedata.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0;
  bytedata.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  testing::Message::Message((Message *)&sStack_58);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)&privkey,(internal *)&bytedata,(AssertionResult *)0x414853,"false","true",
             in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_50,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
             ,0x34,(char *)privkey.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
  testing::internal::AssertHelper::operator=(&local_50,(Message *)&sStack_58);
  testing::internal::AssertHelper::~AssertHelper(&local_50);
  std::__cxx11::string::~string((string *)&privkey);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&sStack_58);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&bytedata.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

TEST(Privkey, Privkey_ByteData_Error) {
  try {
    ByteData bytedata(
        "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f2701");
    Privkey privkey(bytedata);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "Invalid Privkey data.");
    return;
  }
  ASSERT_TRUE(false);
}